

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_calendar_records.c
# Opt level: O1

void CGTFS_RecordCalendarRecord(void)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined **ppuVar4;
  char *pcVar5;
  calendar_record_t *pcVar6;
  byte bVar7;
  calendar_record_t a;
  char *field_values [10];
  char *field_names [10];
  calendar_record_t cStack_158;
  calendar_record_t local_e8;
  calendar_record_t local_78;
  
  bVar7 = 0;
  iVar1 = greatest_test_pre("calendar_record_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      puVar3 = &DAT_00233ca0;
      pcVar6 = &local_78;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(char **)pcVar6->service_id = (char *)*puVar3;
        puVar3 = puVar3 + (ulong)bVar7 * -2 + 1;
        pcVar6 = (calendar_record_t *)((long)pcVar6 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      ppuVar4 = &PTR_anon_var_dwarf_228e_00233cf0;
      pcVar6 = &local_e8;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        *(undefined **)pcVar6->service_id = *ppuVar4;
        ppuVar4 = ppuVar4 + (ulong)bVar7 * -2 + 1;
        pcVar6 = (calendar_record_t *)((long)pcVar6 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      read_calendar_record(&cStack_158,10,(char **)&local_78,(char **)&local_e8);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t("1001",&cStack_158,&greatest_type_info_string,(void *)0x0);
      if (iVar1 == 0) {
        greatest_info.fail_line = 0x15;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_0012028a:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"1001\" != cr_1.service_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("20000101",cStack_158.start_date,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          greatest_info.fail_line = 0x16;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0012028a;
          greatest_info.msg = "\"20000101\" != cr_1.start_date";
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("20201231",cStack_158.end_date,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            greatest_info.fail_line = 0x17;
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_0012028a;
            greatest_info.msg = "\"20201231\" != cr_1.end_date";
          }
          else if (cStack_158.monday == SA_AVAILABLE) {
            if (cStack_158.tuesday == SA_AVAILABLE) {
              if (cStack_158.wednesday == SA_AVAILABLE) {
                if (cStack_158.thursday == SA_AVAILABLE) {
                  if (cStack_158.friday == SA_AVAILABLE) {
                    if (cStack_158.saturday == SA_UNAVAILABLE) {
                      greatest_info.assertions = greatest_info.assertions + 7;
                      if (cStack_158.sunday == SA_UNAVAILABLE) {
                        greatest_info.msg = (char *)0x0;
                        iVar1 = 0;
                        goto LAB_00120357;
                      }
                      greatest_info.fail_line = 0x1e;
                      greatest_info.msg = "SA_UNAVAILABLE != cr_1.sunday";
                    }
                    else {
                      greatest_info.fail_line = 0x1d;
                      greatest_info.msg = "SA_UNAVAILABLE != cr_1.saturday";
                      greatest_info.assertions = greatest_info.assertions + 6;
                    }
                  }
                  else {
                    greatest_info.fail_line = 0x1c;
                    greatest_info.msg = "SA_AVAILABLE != cr_1.friday";
                    greatest_info.assertions = greatest_info.assertions + 5;
                  }
                }
                else {
                  greatest_info.fail_line = 0x1b;
                  greatest_info.msg = "SA_AVAILABLE != cr_1.thursday";
                  greatest_info.assertions = greatest_info.assertions + 4;
                }
              }
              else {
                greatest_info.fail_line = 0x1a;
                greatest_info.msg = "SA_AVAILABLE != cr_1.wednesday";
                greatest_info.assertions = greatest_info.assertions + 3;
              }
            }
            else {
              greatest_info.fail_line = 0x19;
              greatest_info.msg = "SA_AVAILABLE != cr_1.tuesday";
              greatest_info.assertions = greatest_info.assertions + 2;
            }
          }
          else {
            greatest_info.fail_line = 0x18;
            greatest_info.msg = "SA_AVAILABLE != cr_1.monday";
            greatest_info.assertions = greatest_info.assertions + 1;
          }
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
      ;
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_001204ec;
    }
LAB_00120357:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("calendar_record_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    pcVar5 = "SOME_ID1";
    pcVar6 = &cStack_158;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pcVar6 = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar7 * -2 + 1) * 4;
      pcVar6 = (calendar_record_t *)((long)pcVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    pcVar5 = "SOME_ID1";
    pcVar6 = &local_78;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pcVar6->service_id = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar7 * -2 + 1) * 4;
      pcVar6 = (calendar_record_t *)((long)pcVar6 + (ulong)bVar7 * -8 + 4);
    }
    pcVar5 = "SOME_ID1";
    pcVar6 = &local_e8;
    for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined4 *)pcVar6->service_id = *(undefined4 *)pcVar5;
      pcVar5 = pcVar5 + ((ulong)bVar7 * -2 + 1) * 4;
      pcVar6 = (calendar_record_t *)((long)pcVar6 + ((ulong)bVar7 * -2 + 1) * 4);
    }
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_calendar_record(&cStack_158,&local_78);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_calendar_record(&cStack_158,&local_e8);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_calendar_record(&local_78,&local_e8);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_0012044c;
        }
        greatest_info.fail_line = 0x4d;
        greatest_info.msg = "0 != equal_calendar_record(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x4c;
        greatest_info.msg = "0 != equal_calendar_record(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x4b;
      greatest_info.msg = "1 != equal_calendar_record(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
    ;
    iVar1 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_001204ec:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_calendar_records.c"
      ;
      abort();
    }
  }
LAB_0012044c:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordCalendarRecord) {
    RUN_TEST(calendar_record_read);
    RUN_TEST(calendar_record_compare);
}